

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutazione.cpp
# Opt level: O1

long __thiscall Permutazione::random(Permutazione *this)

{
  unsigned_short uVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  result_type rVar4;
  ulong uVar5;
  ulong uVar6;
  param_type local_28;
  
  uVar3 = this->dimensione;
  if (uVar3 != 0) {
    puVar2 = this->individuo;
    uVar5 = 0;
    do {
      puVar2[uVar5] = (unsigned_short)uVar5;
      uVar5 = uVar5 + 1;
      uVar3 = this->dimensione;
    } while (uVar5 < uVar3);
  }
  uVar3 = uVar3 - 1;
  uVar5 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar6 = (ulong)uVar3;
    do {
      local_28 = (param_type)(uVar6 << 0x20);
      rVar4 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_28,&genRand.gen,&local_28);
      puVar2 = this->individuo;
      uVar5 = (ulong)rVar4;
      uVar1 = puVar2[uVar5];
      puVar2[uVar5] = puVar2[uVar6];
      puVar2[uVar6] = uVar1;
      uVar6 = uVar6 - 1;
    } while ((short)uVar6 != 0);
  }
  return uVar5;
}

Assistant:

void Permutazione::random() {
	for (unsigned short j = 0; j < dimensione; j++) {
		individuo[j] = j;
	}

	for (unsigned short k = dimensione - 1; k > 0; k--) {
		int valoreRandom = genRand.randIntU(0, k);

		unsigned short tmp = individuo[valoreRandom];
		individuo[valoreRandom] = individuo[k];
		individuo[k] = tmp;
	}
}